

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Incomplete2DFormatCase::Incomplete2DFormatCase
          (Incomplete2DFormatCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,deUint32 format,deUint32 invalidFormat,int invalidLevelNdx)

{
  IVec2 *size_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  Incomplete2DFormatCase *this_local;
  
  Tex2DCompletenessCase::Tex2DCompletenessCase
            (&this->super_Tex2DCompletenessCase,testCtx,renderCtx,name,description);
  (this->super_Tex2DCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Incomplete2DFormatCase_00cac660;
  *(int *)&(this->super_Tex2DCompletenessCase).field_0x84 = invalidLevelNdx;
  this->m_format = format;
  this->m_invalidFormat = invalidFormat;
  tcu::Vector<int,_2>::Vector(&this->m_size,size);
  return;
}

Assistant:

Incomplete2DFormatCase::Incomplete2DFormatCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, deUint32 format, deUint32 invalidFormat, int invalidLevelNdx)
	: Tex2DCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx			(invalidLevelNdx)
	, m_format					(format)
	, m_invalidFormat			(invalidFormat)
	, m_size					(size)
{
}